

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:495:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:495:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *this_00;
  SceneLoadingTutorialApplication *pSVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  Vec3f dy;
  Vec3f dx;
  Vec3f p0;
  _Any_data local_88;
  pointer local_78;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RStack_70;
  undefined8 local_68;
  Ref<embree::Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  RStack_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28 [16];
  
  this_00 = cin->ptr;
  if (this_00 != (ParseStream *)0x0) {
    (*(this_00->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(this_00);
  }
  pSVar1 = (this->f).this;
  ParseStream::getVec3f((ParseStream *)&p0);
  ParseStream::getVec3f((ParseStream *)&dx);
  ParseStream::getVec3f((ParseStream *)&dy);
  fVar3 = ParseStream::getFloat(this_00);
  fVar4 = ParseStream::getFloat(this_00);
  iVar2 = ParseStream::getInt(this_00);
  local_28 = ZEXT416((uint)p0.field_0.field_0.x);
  local_68 = (pointer)p0.field_0._4_8_;
  RStack_60.ptr =
       (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       0x0;
  local_58 = ZEXT416((uint)dx.field_0.field_0.x);
  local_38 = dx.field_0._4_8_;
  uStack_30 = 0;
  local_48 = dy.field_0._0_8_;
  uStack_40 = 0;
  local_88._M_unused._M_object = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_78 = (pointer)0x0;
  RStack_70.ptr =
       (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       0x0;
  local_88._M_unused._M_object = ::operator_new(0x40);
  (((pointer)local_88._M_unused._0_8_)->first)._M_dataplus._M_p = (pointer)pSVar1;
  *(undefined4 *)&(((pointer)local_88._M_unused._0_8_)->first)._M_string_length = local_28._0_4_;
  *(undefined4 *)((long)&(((pointer)local_88._M_unused._0_8_)->first)._M_string_length + 4) =
       (undefined4)local_68;
  *(undefined4 *)&(((pointer)local_88._M_unused._0_8_)->first).field_2 = local_68._4_4_;
  *(undefined4 *)((long)&(((pointer)local_88._M_unused._0_8_)->first).field_2 + 4) = local_58._0_4_;
  *(undefined4 *)((long)&(((pointer)local_88._M_unused._0_8_)->first).field_2 + 8) =
       (undefined4)local_38;
  *(undefined4 *)((long)&(((pointer)local_88._M_unused._0_8_)->first).field_2 + 0xc) =
       local_38._4_4_;
  *(int *)&(((pointer)local_88._M_unused._0_8_)->second).fileName.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr = (int)local_48;
  *(int *)((long)&(((pointer)local_88._M_unused._0_8_)->second).fileName.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + 4) = (int)((ulong)local_48 >> 0x20);
  *(float *)&(((pointer)local_88._M_unused._0_8_)->second).fileName.
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi = dy.field_0.field_0.z;
  *(float *)((long)&(((pointer)local_88._M_unused._0_8_)->second).fileName.
                    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi + 4) = fVar3;
  *(float *)&(((pointer)local_88._M_unused._0_8_)->second).lineNumber = fVar4;
  (((pointer)local_88._M_unused._0_8_)->second).colNumber = (long)iVar2;
  RStack_70.ptr =
       (Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:502:27)>
       ::_M_invoke;
  local_78 = (pointer)std::
                      _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:502:27)>
                      ::_M_manager;
  std::vector<std::function<void()>,std::allocator<std::function<void()>>>::
  emplace_back<std::function<void()>>
            ((vector<std::function<void()>,std::allocator<std::function<void()>>> *)&pSVar1->futures
             ,(function<void_()> *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  (*(this_00->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(this_00);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }